

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O3

bool __thiscall crnd::crn_unpacker::decode_color_selectors(crn_unpacker *this)

{
  vector<unsigned_int> *this_00;
  ushort uVar1;
  crn_header *pcVar2;
  uint *puVar3;
  uint *puVar4;
  bool bVar5;
  bool bVar6;
  byte bVar7;
  uint32 uVar8;
  int iVar9;
  uint8 *puVar10;
  byte bVar11;
  uint uVar12;
  byte bVar13;
  byte bVar14;
  ulong uVar15;
  uint uVar16;
  byte bVar17;
  byte bVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  bool bVar22;
  static_huffman_data_model dm;
  static_huffman_data_model local_58;
  
  pcVar2 = this->m_pHeader;
  bVar11 = (pcVar2->m_format).m_buf[0];
  bVar5 = true;
  if (bVar11 - 0xc < 3) {
LAB_00113905:
    bVar22 = bVar11 == 0xc;
  }
  else {
    bVar22 = true;
    if (1 < bVar11 - 10) {
      bVar5 = false;
      goto LAB_00113905;
    }
  }
  uVar12 = (uint)(pcVar2->m_color_selectors).m_size.m_buf[2] |
           (uint)(pcVar2->m_color_selectors).m_size.m_buf[1] << 8 |
           (uint)(pcVar2->m_color_selectors).m_size.m_buf[0] << 0x10;
  if (uVar12 != 0) {
    puVar10 = this->m_pData +
              ((ulong)(pcVar2->m_color_selectors).m_ofs.m_buf[2] |
              (ulong)((uint)(pcVar2->m_color_selectors).m_ofs.m_buf[0] << 0x10 |
                     (uint)(pcVar2->m_color_selectors).m_ofs.m_buf[1] << 8));
    (this->m_codec).m_pDecode_buf = puVar10;
    (this->m_codec).m_pDecode_buf_next = puVar10;
    (this->m_codec).m_decode_buf_size = uVar12;
    (this->m_codec).m_pDecode_buf_end = puVar10 + uVar12;
    (this->m_codec).m_bit_buf = 0;
    (this->m_codec).m_bit_count = 0;
  }
  local_58.m_total_syms = 0;
  local_58.m_code_sizes.m_p = (uchar *)0x0;
  local_58.m_code_sizes.m_size = 0;
  local_58.m_code_sizes.m_capacity = 0;
  local_58.m_code_sizes.m_alloc_failed = false;
  local_58.m_pDecode_tables = (decoder_tables *)0x0;
  symbol_codec::decode_receive_static_data_model(&this->m_codec,&local_58);
  uVar1 = *(ushort *)(this->m_pHeader->m_color_selectors).m_num.m_buf;
  uVar19 = (uint)(ushort)(uVar1 << 8 | uVar1 >> 8) << bVar22;
  this_00 = &this->m_color_selectors;
  uVar12 = (this->m_color_selectors).m_size;
  if (uVar12 != uVar19) {
    if (uVar12 <= uVar19) {
      if ((this->m_color_selectors).m_capacity < uVar19) {
        bVar6 = elemental_vector::increase_capacity
                          ((elemental_vector *)this_00,uVar19,uVar12 + 1 == uVar19,4,
                           (object_mover)0x0);
        if (!bVar6) {
          (this->m_color_selectors).m_alloc_failed = true;
          goto LAB_00113a13;
        }
        uVar12 = (this->m_color_selectors).m_size;
      }
      memset(this_00->m_p + uVar12,0,(ulong)(uVar19 - uVar12) << 2);
    }
    (this->m_color_selectors).m_size = uVar19;
  }
LAB_00113a13:
  uVar1 = *(ushort *)(this->m_pHeader->m_color_selectors).m_num.m_buf;
  if ((uVar1 & 0xff) != 0 || uVar1 >> 8 != 0) {
    uVar15 = 0;
    uVar12 = 0;
    do {
      uVar19 = 0xfffffffc;
      do {
        uVar19 = uVar19 + 4;
        uVar8 = symbol_codec::decode(&this->m_codec,&local_58);
        uVar12 = uVar12 ^ uVar8 << ((byte)uVar19 & 0x1f);
      } while (uVar19 < 0x1c);
      if (bVar5) {
        uVar20 = ~(uVar12 >> 1 & 0x55555555 ^ uVar12);
        uVar19 = (uint)uVar15 * 2 + 1;
        if (bVar22 == false) {
          uVar19 = (uint)uVar15;
        }
        puVar3 = this_00->m_p;
        bVar18 = 8;
        bVar11 = 0;
        bVar13 = 0;
        iVar9 = 0;
        do {
          puVar4 = this_00->m_p;
          iVar21 = 0;
          bVar17 = bVar18;
          bVar7 = bVar11;
          bVar14 = bVar13;
          do {
            if (bVar22 != false) {
              uVar16 = uVar20 >> (bVar7 & 0x1f);
              puVar4[uVar15 * 2] =
                   puVar4[uVar15 * 2] | ((uVar16 & 1) << 0x10 | uVar16 >> 1 & 1) << (bVar17 & 0xf);
            }
            uVar16 = uVar20 >> (bVar14 & 0x1f);
            puVar3[uVar19] =
                 puVar3[uVar19] | ((uVar16 & 1) << 0x10 | uVar16 >> 1 & 1) << (bVar17 & 0xf);
            bVar17 = bVar17 + 4;
            iVar21 = iVar21 + -4;
            bVar14 = bVar14 + 2;
            bVar7 = bVar7 + 8;
          } while (iVar21 != -0x10);
          iVar9 = iVar9 + 1;
          bVar18 = bVar18 + 1;
          bVar13 = bVar13 + 8;
          bVar11 = bVar11 + 2;
        } while (iVar9 != 4);
      }
      else {
        this_00->m_p[uVar15] = uVar12 >> 1 & 0x55555555 | (uVar12 * 2 ^ uVar12) & 0xaaaaaaaa;
      }
      uVar15 = uVar15 + 1;
      uVar1 = *(ushort *)(this->m_pHeader->m_color_selectors).m_num.m_buf;
    } while (uVar15 < (ushort)(uVar1 << 8 | uVar1 >> 8));
  }
  static_huffman_data_model::~static_huffman_data_model(&local_58);
  return true;
}

Assistant:

bool decode_color_selectors()
        {
            const bool has_etc_color_blocks = m_pHeader->m_format == cCRNFmtETC1 || m_pHeader->m_format == cCRNFmtETC2 || m_pHeader->m_format == cCRNFmtETC2A || m_pHeader->m_format == cCRNFmtETC1S || m_pHeader->m_format == cCRNFmtETC2AS;
            const bool has_subblocks = m_pHeader->m_format == cCRNFmtETC1 || m_pHeader->m_format == cCRNFmtETC2 || m_pHeader->m_format == cCRNFmtETC2A;
            m_codec.start_decoding(m_pData + m_pHeader->m_color_selectors.m_ofs, m_pHeader->m_color_selectors.m_size);
            static_huffman_data_model dm;
            m_codec.decode_receive_static_data_model(dm);
            m_color_selectors.resize(m_pHeader->m_color_selectors.m_num << (has_subblocks ? 1 : 0));
            for (uint32 s = 0, i = 0; i < m_pHeader->m_color_selectors.m_num; i++)
            {
                for (uint32 j = 0; j < 32; j += 4)
                    s ^= m_codec.decode(dm) << j;
                if (has_etc_color_blocks)
                {
                    for (uint32 selector = (~s & 0xAAAAAAAA) | (~(s ^ s >> 1) & 0x55555555), t = 8, h = 0; h < 4; h++, t -= 15)
                    {
                        for (uint32 w = 0; w < 4; w++, t += 4)
                        {
                            if (has_subblocks)
                            {
                                uint32 s0 = selector >> (w << 3 | h << 1);
                                m_color_selectors[i << 1] |= ((s0 >> 1 & 1) | (s0 & 1) << 16) << (t & 15);
                            }
                            uint32 s1 = selector >> (h << 3 | w << 1);
                            m_color_selectors[has_subblocks ? i << 1 | 1 : i] |= ((s1 >> 1 & 1) | (s1 & 1) << 16) << (t & 15);
                        }
                    }
                }
                else
                {
                    m_color_selectors[i] = ((s ^ s << 1) & 0xAAAAAAAA) | (s >> 1 & 0x55555555);
                }
            }
            m_codec.stop_decoding();
            return true;
        }